

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::lexically_normal(path *__return_storage_ptr__,path *this)

{
  bool bVar1;
  reference ppVar2;
  iterator *this_00;
  char *pcVar3;
  ulong uVar4;
  path local_160;
  iterator local_140;
  undefined1 local_100 [8];
  path root;
  string_type s;
  undefined1 local_b8 [8];
  iterator __end2;
  undefined1 local_68 [8];
  iterator __begin2;
  path *__range2;
  bool lastDotDot;
  path *this_local;
  path *dest;
  
  path(__return_storage_ptr__);
  __range2._6_1_ = false;
  __begin2._current._path.field_2._8_8_ = this;
  begin((iterator *)local_68,this);
  end((iterator *)local_b8,(path *)__begin2._current._path.field_2._8_8_);
  do {
    bVar1 = iterator::operator!=((iterator *)local_68,(iterator *)local_b8);
    if (!bVar1) {
      iterator::~iterator((iterator *)local_b8);
      iterator::~iterator((iterator *)local_68);
      bVar1 = empty(__return_storage_ptr__);
      if (bVar1) {
        operator=(__return_storage_ptr__,(char (*) [2])0x226cb1);
      }
      return __return_storage_ptr__;
    }
    ppVar2 = iterator::operator*((iterator *)local_68);
    operator_cast_to_string((string_type *)((long)&root._path.field_2 + 8),ppVar2);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&root._path.field_2 + 8),".");
    if (bVar1) {
      operator/=(__return_storage_ptr__,(char (*) [1])0x228cc2);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&root._path.field_2 + 8),"..");
      if ((bVar1) && (bVar1 = empty(__return_storage_ptr__), !bVar1)) {
        root_path((path *)local_100,this);
        bVar1 = filesystem::operator==(__return_storage_ptr__,(path *)local_100);
        if (bVar1) {
          s.field_2._12_4_ = 3;
        }
        else {
          end(&local_140,__return_storage_ptr__);
          this_00 = iterator::operator--(&local_140);
          ppVar2 = iterator::operator*(this_00);
          path<char[3],ghc::filesystem::path>(&local_160,(char (*) [3])"..",auto_format);
          bVar1 = filesystem::operator!=(ppVar2,&local_160);
          ~path(&local_160);
          iterator::~iterator(&local_140);
          if (bVar1) {
            pcVar3 = (char *)std::__cxx11::string::back();
            if (*pcVar3 == '/') {
              std::__cxx11::string::pop_back();
            }
            remove_filename(__return_storage_ptr__);
            s.field_2._12_4_ = 3;
          }
          else {
            s.field_2._12_4_ = 0;
          }
        }
        ~path((path *)local_100);
        if (s.field_2._12_4_ != 0) goto LAB_001a4d35;
      }
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) || (__range2._6_1_ == false)) {
        operator/=(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&root._path.field_2 + 8));
      }
      __range2._6_1_ =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&root._path.field_2 + 8),"..");
    }
LAB_001a4d35:
    std::__cxx11::string::~string((string *)(root._path.field_2._M_local_buf + 8));
    iterator::operator++((iterator *)local_68);
  } while( true );
}

Assistant:

GHC_INLINE path path::lexically_normal() const
{
    path dest;
    bool lastDotDot = false;
    for (string_type s : *this) {
        if (s == ".") {
            dest /= "";
            continue;
        }
        else if (s == ".." && !dest.empty()) {
            auto root = root_path();
            if (dest == root) {
                continue;
            }
            else if (*(--dest.end()) != "..") {
                if (dest._path.back() == generic_separator) {
                    dest._path.pop_back();
                }
                dest.remove_filename();
                continue;
            }
        }
        if (!(s.empty() && lastDotDot)) {
            dest /= s;
        }
        lastDotDot = s == "..";
    }
    if (dest.empty()) {
        dest = ".";
    }
    return dest;
}